

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int PNode_equal(Parser *p,PNode *pn,D_Reduction *r,VecZNode *path,D_Shift *sh)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pPVar3;
  PNode *pPVar4;
  int iVar5;
  PNode *pn_00;
  PNode *pPVar6;
  uint uVar7;
  PNode *_t;
  
  iVar5 = 0;
  if (sh != (D_Shift *)0x0) {
    return (int)(pn->shift == sh);
  }
  if (pn->reduction == r) {
    uVar2 = (pn->children).n;
    if (uVar2 == 0 && path == (VecZNode *)0x0) {
      iVar5 = 1;
    }
    else if (uVar2 == path->n) {
      uVar7 = 0;
      do {
        if (uVar7 == uVar2) {
          return 1;
        }
        pPVar6 = (pn->children).v[uVar7];
        pPVar3 = path->v[~uVar7 + uVar2]->pn;
        pn_00 = pPVar6->latest;
        while (pPVar4 = pn_00->latest, pn_00 != pPVar4) {
          pPVar4->refcount = pPVar4->refcount + 1;
          puVar1 = &pn_00->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pn_00);
          }
          pPVar6->latest = pPVar4;
          pn_00 = pPVar4;
        }
        pPVar6 = pPVar3->latest;
        while (pPVar4 = pPVar6->latest, pPVar6 != pPVar4) {
          pPVar4->refcount = pPVar4->refcount + 1;
          puVar1 = &pPVar6->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pPVar6);
          }
          pPVar3->latest = pPVar4;
          pPVar6 = pPVar4;
        }
        uVar7 = uVar7 + 1;
        iVar5 = 0;
      } while (pn_00 == pPVar6);
    }
    return iVar5;
  }
  return iVar5;
}

Assistant:

static int PNode_equal(Parser *p, PNode *pn, D_Reduction *r, VecZNode *path, D_Shift *sh) {
  uint i, n = pn->children.n;
  if (sh) return sh == pn->shift;
  if (r != pn->reduction) return 0;
  if (!path && !n) return 1;
  if (n == path->n) {
    for (i = 0; i < n; i++) {
      PNode *x = pn->children.v[i], *y = path->v[n - i - 1]->pn;
      LATEST(p, x);
      LATEST(p, y);
      if (x != y) return 0;
    }
    return 1;
  }
  return 0;
}